

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void baryonyx::info<int,std::__cxx11::string>
               (context *ctx,char *fmt,int *arg1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  int *arg1_local;
  char *fmt_local;
  context *ctx_local;
  
  bVar1 = is_loggable(ctx->log_priority,6);
  if (bVar1) {
    log<int,std::__cxx11::string>(_stdout,(FILE *)0x6,(int)fmt,(char *)arg1,(int *)args,in_R9);
  }
  return;
}

Assistant:

void
info(const context& ctx,
     const char* fmt,
     const Arg1& arg1,
     const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
    if (!is_loggable(ctx.log_priority, 6))
        return;

    log(stdout, 6, fmt, arg1, args...);
#else
    detail::sink(ctx, fmt, arg1, args...);
#endif
}